

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFParser::parseRemainder(QPDFParser *this,bool content_stream)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *this_00;
  token_type_e tVar1;
  Tokenizer *pTVar2;
  size_type sVar3;
  longlong *plVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int count;
  qpdf_offset_t qVar8;
  longlong lVar9;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  StackFrame *pSVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  undefined7 extraout_var;
  ulong uVar14;
  logic_error *this_01;
  char in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  undefined7 in_register_00000031;
  QPDFParser *this_02;
  QPDFObjectHandle QVar16;
  string s;
  allocator<char> local_ee;
  allocator<char> local_ed;
  allocator<char> local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  key_type local_e8;
  ulong local_c8;
  vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *local_c0;
  longlong *local_b8;
  string local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  this_02 = (QPDFParser *)CONCAT71(in_register_00000031,content_stream);
  this_02->bad_count = 0;
  local_b8 = this_02->int_buffer;
  local_c0 = (vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
             &this_02->stack;
  local_c8 = 0;
LAB_001ad664:
  bVar5 = ::qpdf::Tokenizer::nextToken
                    (this_02->tokenizer,this_02->input,this_02->object_description,0);
  if (!bVar5) {
    warn(this_02,&this_02->tokenizer->error_message);
  }
  this_02->good_count = this_02->good_count + 1;
  iVar6 = this_02->int_count;
  if (iVar6 != 0) {
    tVar1 = this_02->tokenizer->type;
    if (tVar1 == tt_integer) {
      this_02->int_count = iVar6 + 1;
      if (1 < iVar6) {
        addInt(this_02,iVar6 + 1);
      }
      qVar8 = InputSource::getLastOffset(this_02->input);
      this_02->last_offset_buffer[this_02->int_count % 2] = qVar8;
      lVar9 = QUtil::string_to_ll((&this_02->tokenizer->val)
                                  [(this_02->tokenizer->type & ~tt_array_open) != tt_name].
                                  _M_dataplus._M_p);
      this_02->int_buffer[this_02->int_count % 2] = lVar9;
      goto LAB_001ad664;
    }
    if (tVar1 == tt_word && 1 < iVar6) {
      bVar5 = std::operator==(&this_02->tokenizer->raw_val,"R");
      plVar4 = local_b8;
      if (bVar5) {
        if (this_02->context == (QPDF *)0x0) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_01,
                     "QPDFParser::parse called without context on an object with indirect references"
                    );
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        iVar6 = QIntC::IntConverter<long_long,_int,_true,_true>::convert
                          (local_b8 + (this_02->int_count + -1) % 2);
        uVar7 = QIntC::IntConverter<long_long,_int,_true,_true>::convert
                          (plVar4 + this_02->int_count % 2);
        if ((iVar6 < 1) || (0xfffe < uVar7)) {
          addNull(this_02);
        }
        else {
          QPDF::getObjectForParser((QPDF *)&s,(int)this_02->context,iVar6,SUB41(uVar7,0));
          add(this_02,(shared_ptr<QPDFObject> *)&s);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
        }
        this_02->int_count = 0;
        goto LAB_001ad664;
      }
      iVar6 = this_02->int_count;
    }
    if (0 < iVar6) {
      count = 1;
      if (iVar6 != 1) {
        addInt(this_02,iVar6 + -1);
        count = this_02->int_count;
      }
      addInt(this_02,count);
      this_02->int_count = 0;
    }
  }
  pTVar2 = this_02->tokenizer;
  switch(pTVar2->type) {
  case tt_bad:
    goto switchD_001ad81a_caseD_0;
  case tt_array_close:
    if (((this_02->bad_count != 0) || (this_02->sanity_checks == true)) &&
       (this_02->max_bad_count == 0)) {
LAB_001adfa6:
      tooManyBadTokens(this_02);
      goto LAB_001ae012;
    }
    pSVar11 = this_02->frame;
    if (pSVar11->state != st_array) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"treating unexpected array close token as null",
                 (allocator<char> *)&local_e8);
      warn(this_02,&s);
      break;
    }
    if (pSVar11->null_count < 0x65) {
      QPDFObject::create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                ((QPDFObject *)&s,&pSVar11->olist);
    }
    else {
      local_e8._M_dataplus._M_p._0_1_ = 1;
      QPDFObject::
      create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
                ((QPDFObject *)&s,&pSVar11->olist,(bool *)&local_e8);
    }
    setDescription(this_02,(ObjectPtr *)&s,this_02->frame->offset + -1);
    uVar14 = ((long)(this_02->stack).
                    super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_02->stack).
                   super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xa8;
    if (uVar14 < 2) {
LAB_001adf55:
      sVar3 = s._M_string_length;
      s._M_string_length = 0;
      this->input = (InputSource *)s._M_dataplus._M_p;
      this->object_description = (string *)sVar3;
      s._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::pop_back
                ((vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> *)local_c0
                );
      this_02->frame =
           (this_02->stack).
           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      add(this_02,(shared_ptr<QPDFObject> *)&s);
    }
LAB_001adf6c:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
    _Var15._M_pi = extraout_RDX;
    if (uVar14 < 2) {
LAB_001ae039:
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var15._M_pi;
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (QPDFObjectHandle)
             QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
    goto LAB_001ad664;
  case tt_array_open:
  case tt_dict_open:
    if (499 < (ulong)(((long)(this_02->stack).
                             super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_02->stack).
                            super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xa8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"ignoring excessively deeply nested data structure",
                 (allocator<char> *)&local_e8);
      warn(this_02,&s);
      goto LAB_001ae00a;
    }
    s._M_dataplus._M_p._0_4_ = (uint)(pTVar2->type == tt_array_open) * 2;
    std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
    emplace_back<InputSource&,QPDFParser::parser_state_e>
              (local_c0,this_02->input,(parser_state_e *)&s);
    this_02->frame =
         (this_02->stack).
         super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl
         .super__Vector_impl_data._M_finish + -1;
    local_c8 = 0;
    goto LAB_001ad664;
  case tt_brace_close:
  case tt_brace_open:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"treating unexpected brace token as null",(allocator<char> *)&local_e8);
    warn(this_02,&s);
    break;
  case tt_dict_close:
    if (((this_02->bad_count != 0) || (this_02->sanity_checks == true)) &&
       (this_02->max_bad_count == 0)) goto LAB_001adfa6;
    pSVar11 = this_02->frame;
    if ((int)pSVar11->state < 2) {
      this_00 = &pSVar11->dict;
      if (pSVar11->state == st_dictionary_value) {
        qVar8 = pSVar11->offset;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,"dictionary ended prematurely; using null as value for last key",
                   (allocator<char> *)&local_e8);
        warn(this_02,qVar8,&s);
        std::__cxx11::string::~string((string *)&s);
        QPDFObject::create<QPDF_Null>();
        s._M_dataplus._M_p = local_e8._M_dataplus._M_p;
        s._M_string_length = local_e8._M_string_length;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 0;
        p_Var10 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](this_00,&this_02->frame->key);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var10,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
        pSVar11 = this_02->frame;
      }
      if ((pSVar11->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pSVar11->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        fixMissingKeys(this_02);
        pSVar11 = this_02->frame;
      }
      if ((pSVar11->contents_string)._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&s,"/Type",&local_e9);
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 ::count(this_00,&s);
        if (sVar12 != 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"/Type",&local_ea);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                    ::operator[](this_00,&local_e8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/Sig",&local_eb);
          bVar5 = QPDFObjectHandle::isNameAndEquals(pmVar13,&local_b0);
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"/ByteRange",&local_ec);
            sVar12 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     ::count(this_00,&local_50);
            if (sVar12 == 0) {
              bVar5 = false;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"/Contents",&local_ed);
              sVar12 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                       ::count(this_00,&local_70);
              if (sVar12 == 0) {
                bVar5 = false;
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_90,"/Contents",&local_ee);
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                          ::operator[](this_00,&local_90);
                bVar5 = QPDFObjectHandle::isString(pmVar13);
                std::__cxx11::string::~string((string *)&local_90);
              }
              std::__cxx11::string::~string((string *)&local_70);
            }
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&s);
            if (bVar5 == false) goto LAB_001adeed;
            QPDFObjectHandle::newString(&local_e8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&s,"/Contents",(allocator<char> *)&local_b0);
            p_Var10 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      ::operator[](this_00,&s);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (p_Var10,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_e8);
            std::__cxx11::string::~string((string *)&s);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&s,"/Contents",(allocator<char> *)&local_e8);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      ::operator[](this_00,&s);
            QPDFObjectHandle::setParsedOffset(pmVar13,this_02->frame->contents_offset);
          }
          else {
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_e8);
          }
        }
        std::__cxx11::string::~string((string *)&s);
      }
LAB_001adeed:
      QPDFObject::
      create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>>
                ((QPDFObject *)&s,this_00);
      setDescription(this_02,(ObjectPtr *)&s,this_02->frame->offset + -2);
      uVar14 = ((long)(this_02->stack).
                      super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_02->stack).
                     super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xa8;
      if (uVar14 < 2) goto LAB_001adf55;
      std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::pop_back
                ((vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> *)local_c0
                );
      this_02->frame =
           (this_02->stack).
           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      add(this_02,(shared_ptr<QPDFObject> *)&s);
      goto LAB_001adf6c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"unexpected dictionary close token",(allocator<char> *)&local_e8);
    warn(this_02,&s);
    break;
  case tt_integer:
    if (in_DL == '\0') {
      qVar8 = InputSource::getLastOffset(this_02->input);
      this_02->last_offset_buffer[1] = qVar8;
      lVar9 = QUtil::string_to_ll((&this_02->tokenizer->val)
                                  [(this_02->tokenizer->type & ~tt_array_open) != tt_name].
                                  _M_dataplus._M_p);
      this_02->int_buffer[1] = lVar9;
      this_02->int_count = 1;
    }
    else {
      s._M_dataplus._M_p = (pointer)QUtil::string_to_ll((pTVar2->raw_val)._M_dataplus._M_p);
      addScalar<QPDF_Integer,long_long>(this_02,(longlong *)&s);
    }
    goto LAB_001ad664;
  case tt_name:
    if (this_02->frame->state == st_dictionary_key) {
      std::__cxx11::string::_M_assign((string *)&this_02->frame->key);
      pSVar11 = this_02->frame;
      pSVar11->state = st_dictionary_value;
      local_c8 = 0;
      if (this_02->decrypter != (StringDecrypter *)0x0) {
        bVar5 = std::operator==(&pSVar11->key,"/Contents");
        local_c8 = CONCAT71(extraout_var,bVar5);
      }
    }
    else {
      addScalar<QPDF_Name,std::__cxx11::string_const&>(this_02,&pTVar2->val);
    }
    goto LAB_001ad664;
  case tt_real:
    addScalar<QPDF_Real,std::__cxx11::string_const&>(this_02,&pTVar2->raw_val);
    goto LAB_001ad664;
  case tt_string:
    if (this_02->decrypter == (StringDecrypter *)0x0) {
      addScalar<QPDF_String,std::__cxx11::string_const&>(this_02,&pTVar2->val);
    }
    else {
      if ((local_c8 & 1) != 0) {
        std::__cxx11::string::_M_assign((string *)&this_02->frame->contents_string);
        qVar8 = InputSource::getLastOffset(this_02->input);
        this_02->frame->contents_offset = qVar8;
      }
      std::__cxx11::string::string((string *)&s,(string *)&pTVar2->val);
      (*this_02->decrypter->_vptr_StringDecrypter[2])(this_02->decrypter,&s);
      addScalar<QPDF_String,std::__cxx11::string&>(this_02,&s);
      std::__cxx11::string::~string((string *)&s);
      local_c8 = 0;
    }
    goto LAB_001ad664;
  case tt_null:
    goto switchD_001ad81a_caseD_b;
  case tt_bool:
    bVar5 = std::operator==(&pTVar2->raw_val,"true");
    s._M_dataplus._M_p._0_1_ = bVar5;
    addScalar<QPDF_Bool,bool>(this_02,(bool *)&s);
    goto LAB_001ad664;
  case tt_word:
    if (in_DL == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"unknown token while reading object; treating as string",
                 (allocator<char> *)&local_e8);
      warn(this_02,&s);
      std::__cxx11::string::~string((string *)&s);
      bVar5 = tooManyBadTokens(this_02);
      if (bVar5) goto LAB_001ae012;
      addScalar<QPDF_String,std::__cxx11::string_const&>
                (this_02,&this_02->tokenizer->val +
                         ((this_02->tokenizer->type & ~tt_array_open) != tt_name));
    }
    else {
      addScalar<QPDF_Operator,std::__cxx11::string_const&>(this_02,&pTVar2->raw_val);
    }
    goto LAB_001ad664;
  case tt_eof:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"parse error while reading object",(allocator<char> *)&local_e8);
    warn(this_02,&s);
    std::__cxx11::string::~string((string *)&s);
    if (in_DL == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"unexpected EOF",(allocator<char> *)&local_e8);
      warn(this_02,&s);
LAB_001ae00a:
      std::__cxx11::string::~string((string *)&s);
      goto LAB_001ae012;
    }
    this->input = (InputSource *)0x0;
    this->object_description = (string *)0x0;
    _Var15._M_pi = extraout_RDX_00;
    goto LAB_001ae039;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"treating unknown token type as null while reading object",
               (allocator<char> *)&local_e8);
    warn(this_02,&s);
  }
  std::__cxx11::string::~string((string *)&s);
switchD_001ad81a_caseD_0:
  bVar5 = tooManyBadTokens(this_02);
  if (bVar5) {
LAB_001ae012:
    QPDFObject::create<QPDF_Null>();
    sVar3 = s._M_string_length;
    s._M_string_length = 0;
    this->input = (InputSource *)s._M_dataplus._M_p;
    this->object_description = (string *)sVar3;
    s._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
    _Var15._M_pi = extraout_RDX_01;
    goto LAB_001ae039;
  }
switchD_001ad81a_caseD_b:
  addNull(this_02);
  goto LAB_001ad664;
}

Assistant:

QPDFObjectHandle
QPDFParser::parseRemainder(bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    bad_count = 0;
    bool b_contents = false;

    while (true) {
        if (!tokenizer.nextToken(input, object_description)) {
            warn(tokenizer.getErrorMessage());
        }
        ++good_count; // optimistically

        if (int_count != 0) {
            // Special handling of indirect references. Treat integer tokens as part of an indirect
            // reference until proven otherwise.
            if (tokenizer.getType() == QPDFTokenizer::tt_integer) {
                if (++int_count > 2) {
                    // Process the oldest buffered integer.
                    addInt(int_count);
                }
                last_offset_buffer[int_count % 2] = input.getLastOffset();
                int_buffer[int_count % 2] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                continue;

            } else if (
                int_count >= 2 && tokenizer.getType() == QPDFTokenizer::tt_word &&
                tokenizer.getValue() == "R") {
                if (context == nullptr) {
                    QTC::TC("qpdf", "QPDFParser indirect without context");
                    throw std::logic_error(
                        "QPDFParser::parse called without context on an object "
                        "with indirect references");
                }
                auto id = QIntC::to_int(int_buffer[(int_count - 1) % 2]);
                auto gen = QIntC::to_int(int_buffer[(int_count) % 2]);
                if (!(id < 1 || gen < 0 || gen >= 65535)) {
                    add(QPDF::ParseGuard::getObject(context, id, gen, parse_pdf));
                } else {
                    QTC::TC("qpdf", "QPDFParser invalid objgen");
                    addNull();
                }
                int_count = 0;
                continue;

            } else if (int_count > 0) {
                // Process the buffered integers before processing the current token.
                if (int_count > 1) {
                    addInt(int_count - 1);
                }
                addInt(int_count);
                int_count = 0;
            }
        }

        switch (tokenizer.getType()) {
        case QPDFTokenizer::tt_eof:
            warn("parse error while reading object");
            if (content_stream) {
                // In content stream mode, leave object uninitialized to indicate EOF
                return {};
            }
            QTC::TC("qpdf", "QPDFParser eof in parseRemainder");
            warn("unexpected EOF");
            return {QPDFObject::create<QPDF_Null>()};

        case QPDFTokenizer::tt_bad:
            QTC::TC("qpdf", "QPDFParser bad token in parseRemainder");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_brace_open:
        case QPDFTokenizer::tt_brace_close:
            QTC::TC("qpdf", "QPDFParser bad brace in parseRemainder");
            warn("treating unexpected brace token as null");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_array_close:
            if ((bad_count || sanity_checks) && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state == st_array) {
                auto object = frame->null_count > 100
                    ? QPDFObject::create<QPDF_Array>(std::move(frame->olist), true)
                    : QPDFObject::create<QPDF_Array>(std::move(frame->olist));
                setDescription(object, frame->offset - 1);
                // The `offset` points to the next of "[".  Set the rewind offset to point to the
                // beginning of "[". This has been explicitly tested with whitespace surrounding the
                // array start delimiter. getLastOffset points to the array end token and therefore
                // can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad array close in parseRemainder");
                warn("treating unexpected array close token as null");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_dict_close:
            if ((bad_count || sanity_checks) && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state <= st_dictionary_value) {
                // Attempt to recover more or less gracefully from invalid dictionaries.
                auto& dict = frame->dict;

                if (frame->state == st_dictionary_value) {
                    QTC::TC("qpdf", "QPDFParser no val for last key");
                    warn(
                        frame->offset,
                        "dictionary ended prematurely; using null as value for last key");
                    dict[frame->key] = QPDFObject::create<QPDF_Null>();
                }

                if (!frame->olist.empty()) {
                    fixMissingKeys();
                }

                if (!frame->contents_string.empty() && dict.count("/Type") &&
                    dict["/Type"].isNameAndEquals("/Sig") && dict.count("/ByteRange") &&
                    dict.count("/Contents") && dict["/Contents"].isString()) {
                    dict["/Contents"] = QPDFObjectHandle::newString(frame->contents_string);
                    dict["/Contents"].setParsedOffset(frame->contents_offset);
                }
                auto object = QPDFObject::create<QPDF_Dictionary>(std::move(dict));
                setDescription(object, frame->offset - 2);
                // The `offset` points to the next of "<<". Set the rewind offset to point to the
                // beginning of "<<". This has been explicitly tested with whitespace surrounding
                // the dictionary start delimiter. getLastOffset points to the dictionary end token
                // and therefore can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad dictionary close in parseRemainder");
                warn("unexpected dictionary close token");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_array_open:
        case QPDFTokenizer::tt_dict_open:
            if (stack.size() > 499) {
                QTC::TC("qpdf", "QPDFParser too deep");
                warn("ignoring excessively deeply nested data structure");
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                b_contents = false;
                stack.emplace_back(
                    input,
                    (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array
                                                                          : st_dictionary_key);
                frame = &stack.back();
                continue;
            }

        case QPDFTokenizer::tt_bool:
            addScalar<QPDF_Bool>(tokenizer.getValue() == "true");
            continue;

        case QPDFTokenizer::tt_null:
            addNull();
            continue;

        case QPDFTokenizer::tt_integer:
            if (!content_stream) {
                // Buffer token in case it is part of an indirect reference.
                last_offset_buffer[1] = input.getLastOffset();
                int_buffer[1] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                int_count = 1;
            } else {
                addScalar<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));
            }
            continue;

        case QPDFTokenizer::tt_real:
            addScalar<QPDF_Real>(tokenizer.getValue());
            continue;

        case QPDFTokenizer::tt_name:
            if (frame->state == st_dictionary_key) {
                frame->key = tokenizer.getValue();
                frame->state = st_dictionary_value;
                b_contents = decrypter && frame->key == "/Contents";
                continue;
            } else {
                addScalar<QPDF_Name>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_word:
            if (content_stream) {
                addScalar<QPDF_Operator>(tokenizer.getValue());
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string in parseRemainder");
                warn("unknown token while reading object; treating as string");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addScalar<QPDF_String>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_string:
            {
                auto const& val = tokenizer.getValue();
                if (decrypter) {
                    if (b_contents) {
                        frame->contents_string = val;
                        frame->contents_offset = input.getLastOffset();
                        b_contents = false;
                    }
                    std::string s{val};
                    decrypter->decryptString(s);
                    addScalar<QPDF_String>(s);
                } else {
                    addScalar<QPDF_String>(val);
                }
            }
            continue;

        default:
            warn("treating unknown token type as null while reading object");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
        }
    }
}